

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O0

void * coll_tmap_insert(coll_tmap_t *map,void *key,void *value)

{
  void *pvVar1;
  entry_t_conflict *peVar2;
  entry_t_conflict *entry;
  void *old;
  entry_t_conflict *peStack_38;
  int result;
  entry_t_conflict *parent;
  entry_t_conflict *cur;
  void *value_local;
  void *key_local;
  coll_tmap_t *map_local;
  
  parent = map->root;
  if (parent == (coll_tmap_entry_t *)0x0) {
    peVar2 = entry_new(key,value,(void *)0x0);
    map->root = peVar2;
    map->size = map->size + 1;
  }
  else {
    peStack_38 = (entry_t_conflict *)0x0;
    old._4_4_ = 0;
    while (parent != (entry_t_conflict *)0x0) {
      peStack_38 = parent;
      old._4_4_ = (*map->cmp)(key,parent->key);
      if (old._4_4_ < 0) {
        parent = parent->left;
      }
      else {
        if (old._4_4_ < 1) {
          pvVar1 = parent->val;
          parent->val = value;
          return pvVar1;
        }
        parent = parent->right;
      }
    }
    peVar2 = entry_new(key,value,peStack_38);
    if (old._4_4_ < 0) {
      peStack_38->left = peVar2;
    }
    else {
      peStack_38->right = peVar2;
    }
    coll_tmap_balance_insert(map,peVar2);
    map->size = map->size + 1;
  }
  return (void *)0x0;
}

Assistant:

void *coll_tmap_insert(coll_tmap_t *map, void *key, void *value) {
    entry_t *cur = map->root;
    if (!cur) {
        map->root = entry_new(key, value, NULL);
        ++(map->size);
        return NULL;
    }
    entry_t *parent = NULL;
    int result = 0;
    while (cur) {
        parent = cur;
        result = map->cmp(key, cur->key);
        if (result < 0) {
            cur = cur->left;
        } else if (result > 0) {
            cur = cur->right;
        } else {
            void *old = cur->val;
            cur->val = value;
            return old;
        }
    }
    entry_t *entry = entry_new(key, value, parent);
    if (result < 0) {
        parent->left = entry;
    } else {
        parent->right = entry;
    }
    coll_tmap_balance_insert(map, entry);
    ++(map->size);
    return NULL;
}